

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_core.c
# Opt level: O0

int asterism_core_prepare(asterism_s *as)

{
  char *pcVar1;
  asterism_str s;
  asterism_str s_00;
  asterism_str s_01;
  int iVar2;
  uv_loop_t *puVar3;
  check_timer_s *__s;
  asterism_str aVar4;
  char *local_100;
  asterism_str __host_3;
  asterism_host_type local_e8;
  int ret_addr_2;
  asterism_host_type host_type_2;
  uint port_2;
  asterism_str host_2;
  asterism_str scheme_2;
  asterism_str __host_2;
  asterism_host_type local_a8;
  int ret_addr_1;
  asterism_host_type host_type_1;
  uint port_1;
  asterism_str host_1;
  asterism_str scheme_1;
  asterism_str __host_1;
  asterism_str __host;
  asterism_host_type local_58;
  int ret_addr;
  asterism_host_type host_type;
  uint port;
  asterism_str host;
  asterism_str scheme;
  char *inner_bind_addr;
  asterism_slist *item;
  asterism_slist *next;
  int ret;
  asterism_s *as_local;
  
  puVar3 = uv_loop_new();
  as->loop = puVar3;
  if (as->idle_timeout == 0) {
    as->idle_timeout = 0x3c;
  }
  if (as->reconnect_delay == 0) {
    as->reconnect_delay = 10000;
  }
  if (as->heartbeart_interval == 0) {
    as->heartbeart_interval = 30000;
  }
  _global_proto_ping.len = htons(4);
  _global_proto_pong.len = htons(4);
  as->conns_queue[0] = as->conns_queue;
  as->conns_queue[1] = as->conns_queue;
  if (as->inner_bind_addrs != (asterism_slist *)0x0) {
    inner_bind_addr = (char *)as->inner_bind_addrs;
    do {
      pcVar1 = *(char **)(inner_bind_addr + 8);
      host.p = (char *)0x0;
      iVar2 = asterism_parse_address
                        (*(char **)inner_bind_addr,(asterism_str *)&host.len,
                         (asterism_str *)&host_type,(uint *)&ret_addr,&local_58);
      if (iVar2 != 0) {
        return 5;
      }
      iVar2 = asterism_str_empty((asterism_str *)&host.len);
      if (iVar2 != 0) {
        return 7;
      }
      iVar2 = asterism_vcasecmp((asterism_str *)&host.len,"http");
      if (iVar2 == 0) {
        s_01.len = (size_t)host.p;
        s_01.p = _host_type;
        aVar4 = asterism_strdup_nul(s_01);
        __host_1.len = (size_t)aVar4.p;
        iVar2 = asterism_inner_http_init(as,(char *)__host_1.len,(uint *)&ret_addr);
        free((void *)__host_1.len);
      }
      else {
        iVar2 = asterism_vcasecmp((asterism_str *)&host.len,"socks5");
        if (iVar2 != 0) {
          return 7;
        }
        aVar4.len = (size_t)host.p;
        aVar4.p = _host_type;
        aVar4 = asterism_strdup_nul(aVar4);
        scheme_1.len = (size_t)aVar4.p;
        iVar2 = asterism_inner_socks5_init(as,(char *)scheme_1.len,(uint *)&ret_addr);
        free((void *)scheme_1.len);
      }
      if (iVar2 != 0) {
        return iVar2;
      }
      inner_bind_addr = pcVar1;
    } while (pcVar1 != (char *)0x0);
  }
  if (as->outer_bind_addr != (char *)0x0) {
    host_1.p = (char *)0x0;
    iVar2 = asterism_parse_address
                      (as->outer_bind_addr,(asterism_str *)&host_1.len,(asterism_str *)&host_type_1,
                       (uint *)&ret_addr_1,&local_a8);
    if (iVar2 != 0) {
      return 5;
    }
    iVar2 = asterism_vcasecmp((asterism_str *)&host_1.len,"tcp");
    if ((iVar2 != 0) && (iVar2 = asterism_str_empty((asterism_str *)&host_1.len), iVar2 == 0)) {
      return 7;
    }
    s_00.len = (size_t)host_1.p;
    s_00.p = _host_type_1;
    aVar4 = asterism_strdup_nul(s_00);
    scheme_2.len = (size_t)aVar4.p;
    iVar2 = asterism_outer_tcp_init(as,(char *)scheme_2.len,(uint *)&ret_addr_1);
    free((void *)scheme_2.len);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  if (as->connect_addr != (char *)0x0) {
    host_2.p = (char *)0x0;
    if ((as->username == (char *)0x0) || (as->password == (char *)0x0)) {
      return 6;
    }
    iVar2 = asterism_parse_address
                      (as->connect_addr,(asterism_str *)&host_2.len,(asterism_str *)&host_type_2,
                       (uint *)&ret_addr_2,&local_e8);
    if (iVar2 != 0) {
      return 5;
    }
    iVar2 = asterism_vcasecmp((asterism_str *)&host_2.len,"tcp");
    if ((iVar2 != 0) && (iVar2 = asterism_str_empty((asterism_str *)&host_2.len), iVar2 == 0)) {
      return 7;
    }
    s.len = (size_t)host_2.p;
    s.p = _host_type_2;
    aVar4 = asterism_strdup_nul(s);
    local_100 = aVar4.p;
    iVar2 = asterism_connector_tcp_init(as,local_100,ret_addr_2);
    free(local_100);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  __s = (check_timer_s *)malloc(0xa8);
  memset(__s,0,0xa8);
  as->check_timer = __s;
  (as->check_timer->timer).data = as->check_timer;
  as->check_timer->close = check_timer_close;
  as->check_timer->as = as;
  iVar2 = uv_timer_init(as->loop,&as->check_timer->timer);
  if (iVar2 == 0) {
    iVar2 = uv_timer_start(&as->check_timer->timer,check_timer_cb,1000,1000);
    if (iVar2 == 0) {
      next._4_4_ = 0;
    }
    else {
      next._4_4_ = 1;
    }
  }
  else {
    next._4_4_ = 1;
  }
  return next._4_4_;
}

Assistant:

int asterism_core_prepare(struct asterism_s *as)
{
    int ret = ASTERISM_E_OK;
    as->loop = uv_loop_new();
    if (as->idle_timeout == 0) {
        as->idle_timeout = ASTERISM_CONNECTION_MAX_IDLE_COUNT;
    }
    if (as->reconnect_delay == 0) {
        as->reconnect_delay = ASTERISM_RECONNECT_DELAY;
    }
    if (as->heartbeart_interval == 0) {
        as->heartbeart_interval = ASTERISM_HEARTBEART_INTERVAL;
    }
    _global_proto_ping.len = htons(sizeof(_global_proto_ping));
    _global_proto_pong.len = htons(sizeof(_global_proto_pong));

    QUEUE_INIT(&as->conns_queue);

    struct asterism_slist *next;
    struct asterism_slist *item;
    if (as->inner_bind_addrs) {
        item = as->inner_bind_addrs;
        do
        {
            next = item->next;
            char *inner_bind_addr = item->data;
            struct asterism_str scheme;
            struct asterism_str host;
            unsigned int port;
            asterism_host_type host_type;
            scheme.len = 0;
            host.len = 0;
            int ret_addr = asterism_parse_address(inner_bind_addr, &scheme, &host, &port, &host_type);
            if (ret_addr)
            {
                ret = ASTERISM_E_ADDRESS_PARSE_ERROR;
                goto cleanup;
            }
            if (asterism_str_empty(&scheme))
            {
                ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
                goto cleanup;
            }
            if (asterism_vcasecmp(&scheme, "http") == 0)
            {
                struct asterism_str __host = asterism_strdup_nul(host);
                ret = asterism_inner_http_init(as, __host.p, &port);
                AS_FREE((char *)__host.p);
                if (ret)
                    goto cleanup;
            }
            else if (asterism_vcasecmp(&scheme, "socks5") == 0)
            {
                struct asterism_str __host = asterism_strdup_nul(host);
                ret = asterism_inner_socks5_init(as, __host.p, &port);
                AS_FREE((char *)__host.p);
                if (ret)
                    goto cleanup;
            }
            else
            {
                ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
                goto cleanup;
            }
            item = next;
        } while (next);
    }

    if (as->outer_bind_addr)
    {
        struct asterism_str scheme;
        struct asterism_str host;
        unsigned int port;
        asterism_host_type host_type;
        scheme.len = 0;
        host.len = 0;
        int ret_addr = asterism_parse_address(as->outer_bind_addr, &scheme, &host, &port, &host_type);
        if (ret_addr)
        {
            ret = ASTERISM_E_ADDRESS_PARSE_ERROR;
            goto cleanup;
        }
        if (asterism_vcasecmp(&scheme, "tcp") && !asterism_str_empty(&scheme))
        {
            ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
            goto cleanup;
        }
        struct asterism_str __host = asterism_strdup_nul(host);
        ret = asterism_outer_tcp_init(as, __host.p, &port);
        AS_FREE((char *)__host.p);
        if (ret)
            goto cleanup;
    }
    if (as->connect_addr)
    {
        struct asterism_str scheme;
        struct asterism_str host;
        unsigned int port;
        asterism_host_type host_type;
        scheme.len = 0;
        host.len = 0;
        if (!as->username || !as->password)
        {
            ret = ASTERISM_E_USERPASS_EMPTY;
            goto cleanup;
        }
        int ret_addr = asterism_parse_address(as->connect_addr, &scheme, &host, &port, &host_type);
        if (ret_addr)
        {
            ret = ASTERISM_E_ADDRESS_PARSE_ERROR;
            goto cleanup;
        }
        if (asterism_vcasecmp(&scheme, "tcp") && !asterism_str_empty(&scheme))
        {
            ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
            goto cleanup;
        }
        struct asterism_str __host = asterism_strdup_nul(host);
        ret = asterism_connector_tcp_init(as, __host.p, port);
        AS_FREE((char *)__host.p);
        if (ret)
            goto cleanup;
    }

    as->check_timer = AS_ZMALLOC(struct check_timer_s);
    ASTERISM_HANDLE_INIT(as->check_timer, timer, check_timer_close);
    as->check_timer->as = as;
    ret = uv_timer_init(as->loop, &as->check_timer->timer);
    if (ret != 0)
    {
        ret = ASTERISM_E_FAILED;
        goto cleanup;
    }
    ret = uv_timer_start(&as->check_timer->timer, check_timer_cb, 1 * 1000, 1 * 1000);
    if (ret != 0)
    {
        ret = ASTERISM_E_FAILED;
        goto cleanup;
    }
cleanup:
    return ret;
}